

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Simplex_tree.h
# Opt level: O0

pair<boost::container::dtl::iterator_from_iiterator<boost::intrusive::tree_iterator<boost::intrusive::bhtraits<boost::container::dtl::tree_node<std::pair<const_int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Stable_options>_>_>,_void_*,_(boost::container::tree_type_enum)0,_true>,_boost::intrusive::rbtree_node_traits<void_*,_true>,_(boost::intrusive::link_mode_type)0,_boost::intrusive::dft_tag,_3U>,_false>,_true>,_bool>
 __thiscall
Gudhi::Simplex_tree<Stable_options>::insert_simplex<std::initializer_list<int>>
          (Simplex_tree<Stable_options> *this,initializer_list<int> *simplex,
          Filtration_value *filtration)

{
  initializer_list<int> __ils;
  initializer_list<int> __ils_00;
  int *__first;
  int *__last;
  iterator __first_00;
  iterator __last_00;
  undefined8 extraout_RDX;
  undefined8 extraout_RDX_00;
  undefined8 uVar1;
  pair<boost::container::dtl::iterator_from_iiterator<boost::intrusive::tree_iterator<boost::intrusive::bhtraits<boost::container::dtl::tree_node<std::pair<const_int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Stable_options>_>_>,_void_*,_(boost::container::tree_type_enum)0,_true>,_boost::intrusive::rbtree_node_traits<void_*,_true>,_(boost::intrusive::link_mode_type)0,_boost::intrusive::dft_tag,_3U>,_false>,_true>,_bool>
  pVar2;
  allocator<int> local_81;
  undefined1 local_80 [8];
  vector<int,_std::allocator<int>_> copy;
  iterator_from_iiterator<boost::intrusive::tree_iterator<boost::intrusive::bhtraits<boost::container::dtl::tree_node<std::pair<const_int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Stable_options>_>_>,_void_*,_(boost::container::tree_type_enum)0,_true>,_boost::intrusive::rbtree_node_traits<void_*,_true>,_(boost::intrusive::link_mode_type)0,_boost::intrusive::dft_tag,_3U>,_false>,_true>
  local_60;
  Filtration_value local_58;
  Filtration_value local_50;
  int *local_48;
  int *last;
  Filtration_value local_38;
  int *local_30;
  int *first;
  Filtration_value *filtration_local;
  initializer_list<int> *simplex_local;
  Simplex_tree<Stable_options> *this_local;
  
  last = (int *)*filtration;
  local_38 = filtration[1];
  __ils._M_array = (iterator)filtration[0];
  __ils._M_len = (size_type)filtration[1];
  filtration_local = filtration;
  simplex_local = simplex;
  this_local = this;
  local_30 = std::begin<int>(__ils);
  local_58 = *filtration_local;
  local_50 = filtration_local[1];
  __ils_00._M_array = (iterator)filtration_local[0];
  __ils_00._M_len = (size_type)filtration_local[1];
  __last = std::end<int>(__ils_00);
  __first = local_30;
  local_48 = __last;
  if (local_30 == __last) {
    null_simplex();
    copy.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage._7_1_ = 1;
    std::
    pair<boost::container::dtl::iterator_from_iiterator<boost::intrusive::tree_iterator<boost::intrusive::bhtraits<boost::container::dtl::tree_node<std::pair<const_int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Stable_options>_>_>,_void_*,_(boost::container::tree_type_enum)0,_true>,_boost::intrusive::rbtree_node_traits<void_*,_true>,_(boost::intrusive::link_mode_type)0,_boost::intrusive::dft_tag,_3U>,_false>,_true>,_bool>
    ::
    pair<boost::container::dtl::iterator_from_iiterator<boost::intrusive::tree_iterator<boost::intrusive::bhtraits<boost::container::dtl::tree_node<std::pair<const_int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Stable_options>_>_>,_void_*,_(boost::container::tree_type_enum)0,_true>,_boost::intrusive::rbtree_node_traits<void_*,_true>,_(boost::intrusive::link_mode_type)0,_boost::intrusive::dft_tag,_3U>,_false>,_true>,_bool,_true>
              ((pair<boost::container::dtl::iterator_from_iiterator<boost::intrusive::tree_iterator<boost::intrusive::bhtraits<boost::container::dtl::tree_node<std::pair<const_int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Stable_options>_>_>,_void_*,_(boost::container::tree_type_enum)0,_true>,_boost::intrusive::rbtree_node_traits<void_*,_true>,_(boost::intrusive::link_mode_type)0,_boost::intrusive::dft_tag,_3U>,_false>,_true>,_bool>
                *)this,&local_60,
               (bool *)((long)&copy.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                               super__Vector_impl_data._M_end_of_storage + 7));
    uVar1 = extraout_RDX;
  }
  else {
    std::allocator<int>::allocator(&local_81);
    std::vector<int,std::allocator<int>>::vector<int_const*,void>
              ((vector<int,std::allocator<int>> *)local_80,__first,__last,&local_81);
    std::allocator<int>::~allocator(&local_81);
    __first_00 = std::begin<std::vector<int,std::allocator<int>>>
                           ((vector<int,_std::allocator<int>_> *)local_80);
    __last_00 = std::end<std::vector<int,std::allocator<int>>>
                          ((vector<int,_std::allocator<int>_> *)local_80);
    std::sort<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>>
              ((__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)
               __first_00._M_current,
               (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)
               __last_00._M_current);
    insert_simplex_raw<std::vector<int,std::allocator<int>>>
              (this,(vector<int,_std::allocator<int>_> *)simplex,(Filtration_value *)local_80);
    std::vector<int,_std::allocator<int>_>::~vector((vector<int,_std::allocator<int>_> *)local_80);
    uVar1 = extraout_RDX_00;
  }
  pVar2._8_8_ = uVar1;
  pVar2.first.m_iit.members_.nodeptr_ =
       (tree_iterator<boost::intrusive::bhtraits<boost::container::dtl::tree_node<std::pair<const_int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Stable_options>_>_>,_void_*,_(boost::container::tree_type_enum)0,_true>,_boost::intrusive::rbtree_node_traits<void_*,_true>,_(boost::intrusive::link_mode_type)0,_boost::intrusive::dft_tag,_3U>,_false>
        )(tree_iterator<boost::intrusive::bhtraits<boost::container::dtl::tree_node<std::pair<const_int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Stable_options>_>_>,_void_*,_(boost::container::tree_type_enum)0,_true>,_boost::intrusive::rbtree_node_traits<void_*,_true>,_(boost::intrusive::link_mode_type)0,_boost::intrusive::dft_tag,_3U>,_false>
          )this;
  return pVar2;
}

Assistant:

std::pair<Simplex_handle, bool> insert_simplex(const InputVertexRange & simplex,
                                                 const Filtration_value& filtration = Filtration_value()) {
    auto first = std::begin(simplex);
    auto last = std::end(simplex);

    if (first == last)
      return std::pair<Simplex_handle, bool>(null_simplex(), true);  // ----->>

    // Copy before sorting
    std::vector<Vertex_handle> copy(first, last);
    std::sort(std::begin(copy), std::end(copy));
    return insert_simplex_raw(copy, filtration);
  }